

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom2snsf.cpp
# Opt level: O0

void usage(char *progname)

{
  char *progname_local;
  
  printf("%s %s\n","rom2snsf","[2017-08-11]");
  printf("<%s>\n","http://github.com/loveemu/rom2snsf");
  printf("\n");
  printf("Usage\n");
  printf("-----\n");
  printf("\n");
  printf("Syntax: `%s (options) [SNES ROM files]`\n",progname);
  printf("\n");
  printf("### Options\n");
  printf("\n");
  printf("`--help`\n");
  printf("  : Show help\n");
  printf("\n");
  printf("`-o [output.snsf]`\n");
  printf("  : Specify output filename\n");
  printf("\n");
  printf("`--load [offset]`\n");
  printf("  : Load offset of SNES executable\n");
  printf("\n");
  printf("`--lib [libname.snsflib]`\n");
  printf("  : Specify snsflib library name\n");
  printf("\n");
  printf("`--psfby [name]` (aka. `--snsfby`)\n");
  printf("  : Set creator name of SNSF\n");
  printf("\n");
  return;
}

Assistant:

static void usage(const char * progname)
{
	printf("%s %s\n", APP_NAME, APP_VER);
	printf("<%s>\n", APP_URL);
	printf("\n");
	printf("Usage\n");
	printf("-----\n");
	printf("\n");
	printf("Syntax: `%s (options) [SNES ROM files]`\n", progname);
	printf("\n");

	printf("### Options\n");
	printf("\n");
	printf("`--help`\n");
	printf("  : Show help\n");
	printf("\n");
	printf("`-o [output.snsf]`\n");
	printf("  : Specify output filename\n");
	printf("\n");
	printf("`--load [offset]`\n");
	printf("  : Load offset of SNES executable\n");
	printf("\n");
	printf("`--lib [libname.snsflib]`\n");
	printf("  : Specify snsflib library name\n");
	printf("\n");
	printf("`--psfby [name]` (aka. `--snsfby`)\n");
	printf("  : Set creator name of SNSF\n");
	printf("\n");
}